

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::(anonymous_namespace)::OffsetGatherInt2D::TextBody_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (**(code **)(*this + 0xb8))(&local_30);
  std::operator+(__return_storage_ptr__,&local_30,
                 " test_function(vec4 p) {                                               \n    return textureGatherOffset(my_sampler, vec2(p.x, p.y), ivec2(int(p.z)));    \n}\n"
                );
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string TextBody()
	{
		return Type() + " test_function(vec4 p) {                                               \n"
						"    return textureGatherOffset(my_sampler, vec2(p.x, p.y), ivec2(int(p.z)));    \n"
						"}\n";
	}